

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsWin32Executable(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string *psVar2;
  char *extraout_RDX;
  string_view value;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"WIN32_EXECUTABLE",&local_a1);
  psVar2 = GetSafeProperty(this,&local_60);
  std::__cxx11::string::string((string *)&local_80,(string *)psVar2);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  cmGeneratorExpression::Evaluate
            (&local_40,&local_80,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_a0);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)local_40._M_dataplus._M_p;
  bVar1 = cmValue::IsOn((cmValue *)local_40._M_string_length,value);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::IsWin32Executable(const std::string& config) const
{
  return cmIsOn(cmGeneratorExpression::Evaluate(
    this->GetSafeProperty("WIN32_EXECUTABLE"), this->LocalGenerator, config));
}